

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_221797::WPKHDescriptor::~WPKHDescriptor(WPKHDescriptor *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DescriptorImpl::~DescriptorImpl(&this->super_DescriptorImpl);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0x58);
    return;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript>, FlatSigningProvider& out) const override
    {
        CKeyID id = keys[0].GetID();
        out.pubkeys.emplace(id, keys[0]);
        return Vector(GetScriptForDestination(WitnessV0KeyHash(id)));
    }